

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  char *pcVar1;
  sqlite3_stmt *psVar2;
  int iVar3;
  int iVar4;
  int iLangid;
  int iVar5;
  Mem *pMVar6;
  i64 iVar7;
  uchar *zText;
  u32 *pnWord;
  long lVar8;
  long in_FS_OFFSET;
  int local_54;
  sqlite3_value *local_50;
  sqlite3_stmt *local_48;
  sqlite3_value *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = pRowid;
  local_40 = pRowid;
  iVar3 = fts3SqlStmt(p,7,&local_48,&local_40);
  psVar2 = local_48;
  if (iVar3 == 0) {
    iVar4 = sqlite3_step(local_48);
    if (iVar4 != 100) {
LAB_001ce249:
      local_54 = sqlite3_reset(psVar2);
      iVar3 = local_54;
      if (iVar4 != 100 || local_54 != 0) goto LAB_001ce152;
      if (p->zContentTbl == (char *)0x0) {
        local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = pRowid;
        iVar3 = fts3SqlStmt(p,1,&local_48,&local_40);
        psVar2 = local_48;
        if (iVar3 != 0) goto LAB_001ce152;
        iVar3 = sqlite3_step(local_48);
        if (iVar3 == 100) {
          pMVar6 = columnMem(psVar2,0);
          iVar7 = sqlite3VdbeIntValue(pMVar6);
          columnMallocFailure(psVar2);
          local_54 = sqlite3_reset(psVar2);
          iVar3 = local_54;
          if (local_54 != 0) goto LAB_001ce152;
          if ((int)iVar7 != 0) {
            local_54 = fts3DeleteAll(p,1);
            *pnChng = 0;
            memset(aSzDel,0,(long)p->nColumn * 8 + 8);
            iVar3 = local_54;
            goto LAB_001ce152;
          }
        }
        else {
          local_54 = sqlite3_reset(psVar2);
          iVar3 = local_54;
          if (local_54 != 0) goto LAB_001ce152;
        }
        pcVar1 = p->zContentTbl;
        *pnChng = *pnChng + -1;
        if (pcVar1 == (char *)0x0) {
          fts3SqlExec(&local_54,p,0,&local_50);
        }
      }
      else {
        local_54 = 0;
        *pnChng = *pnChng + -1;
        local_40 = pRowid;
      }
      iVar3 = local_54;
      if (p->bHasDocsize != '\0') {
        fts3SqlExec(&local_54,p,0x13,&local_50);
        iVar3 = local_54;
      }
      goto LAB_001ce152;
    }
    iLangid = langidFromSelect(p,psVar2);
    pMVar6 = columnMem(psVar2,0);
    iVar7 = sqlite3VdbeIntValue(pMVar6);
    columnMallocFailure(psVar2);
    iVar3 = fts3PendingTermsDocid(p,1,iLangid,iVar7);
    if (iVar3 == 0) {
      lVar8 = 1;
      pnWord = aSzDel;
      do {
        if (p->nColumn < lVar8) goto LAB_001ce249;
        iVar3 = 0;
        if (p->abNotindexed[lVar8 + -1] == '\0') {
          zText = sqlite3_column_text(psVar2,(int)lVar8);
          iVar3 = fts3PendingTermsAdd(p,iLangid,(char *)zText,-1,pnWord);
          iVar5 = sqlite3_column_bytes(psVar2,(int)lVar8);
          aSzDel[p->nColumn] = aSzDel[p->nColumn] + iVar5;
        }
        lVar8 = lVar8 + 1;
        pnWord = pnWord + 1;
      } while (iVar3 == 0);
    }
  }
  sqlite3_reset(psVar2);
LAB_001ce152:
  local_54 = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p,
  sqlite3_value *pRowid,
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}